

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::SPxWeightST<double>::setupWeights(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  VectorBase<double> *this_00;
  double dVar1;
  Type TVar2;
  Representation RVar3;
  int iVar4;
  bool *pbVar5;
  Item *pIVar6;
  bool bVar7;
  Real RVar8;
  double *pdVar9;
  pointer pdVar10;
  long lVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_c8;
  
  RVar8 = Tolerances::epsilon((base->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  if ((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.thenum
      < 1) {
    local_c8 = 1.0;
  }
  else {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar1 = *pdVar9;
    local_c8 = 1.0;
    lVar14 = 0;
    do {
      dVar18 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar14];
      ::soplex::infinity::__tls_init();
      if ((dVar18 < dVar1) &&
         (dVar18 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]), local_c8 < dVar18)) {
        local_c8 = dVar18;
      }
      dVar18 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar14];
      ::soplex::infinity::__tls_init();
      if ((-dVar1 < dVar18) &&
         (dVar18 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]), local_c8 < dVar18)) {
        local_c8 = dVar18;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  this_00 = &(base->super_SPxLPBase<double>).super_LPColSetBase<double>.object;
  if (0 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar1 = *pdVar9;
    lVar14 = 0;
    do {
      dVar18 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar14];
      ::soplex::infinity::__tls_init();
      if ((dVar18 < dVar1) &&
         (dVar18 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]), local_c8 < dVar18)) {
        local_c8 = dVar18;
      }
      dVar18 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar14];
      ::soplex::infinity::__tls_init();
      if ((-dVar1 < dVar18) &&
         (dVar18 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]), local_c8 < dVar18)) {
        local_c8 = dVar18;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  TVar2 = base->theType;
  RVar3 = base->theRep;
  dVar1 = VectorBase<double>::maxAbs(this_00);
  if (TVar2 * RVar3 < 1) {
    local_c8 = 0.01 / local_c8;
    lVar14 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar14) {
      pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar18 = *pdVar9;
      dVar16 = -dVar18;
      uVar15 = lVar14 + 1;
      do {
        dVar21 = (double)((base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set.theitem
                          [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                           super_SVSetBase<double>.set.thekey[uVar15 - 2].idx].data.
                          super_SVectorBase<double>.memused + -1) * local_c8 * 0.0001;
        dVar17 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2] * (1.0 / dVar1);
        dVar22 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        dVar20 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        ::soplex::infinity::__tls_init();
        dVar19 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        if (dVar18 <= dVar22) {
          ::soplex::infinity::__tls_init();
          pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (dVar19 <= dVar16) {
            pdVar10[uVar15 - 2] = (dVar21 + -10000.0) - ABS(dVar17);
          }
          else {
            dVar17 = 0.0 - dVar17;
LAB_0022cf9b:
            pdVar10[uVar15 - 2] = dVar21 + dVar17 + local_c8 * dVar20;
            (this->colUp).data[uVar15 - 2] = false;
          }
        }
        else if (RVar8 <= ABS(dVar19 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up
                                       .val.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar15 - 2])) {
          ::soplex::infinity::__tls_init();
          dVar22 = dVar22 * local_c8;
          if (dVar19 <= dVar16) {
            dVar22 = dVar17 + (0.0 - dVar22);
            pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (dVar17 <= 0.0) {
              dVar17 = 1.0 - dVar17;
              goto LAB_0022cf9b;
            }
            dVar22 = (dVar17 + 1.0) - dVar22;
          }
          pdVar10[uVar15 - 2] = dVar21 + dVar22;
          (this->colUp).data[uVar15 - 2] = true;
        }
        else {
          (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15 - 2] = ABS(dVar17) + dVar21 + 100000.0;
        }
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
    }
    lVar14 = (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar14) {
      pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar18 = *pdVar9;
      dVar16 = -dVar18;
      do {
        pIVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                 set.theitem;
        iVar4 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thekey[lVar14 + -1].idx;
        lVar11 = (long)pIVar6[iVar4].data.super_SVectorBase<double>.memused;
        dVar22 = 0.0;
        if (0 < lVar11) {
          uVar15 = lVar11 + 1;
          piVar12 = &pIVar6[iVar4].data.super_SVectorBase<double>.m_elem[lVar11 + -1].idx;
          dVar20 = 0.0;
          do {
            dVar19 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[*piVar12] *
                     ((Nonzero<double> *)(piVar12 + -2))->val;
            dVar17 = dVar22 + dVar19;
            dVar20 = dVar20 + (dVar19 - (dVar17 - dVar22)) + (dVar22 - (dVar17 - (dVar17 - dVar22)))
            ;
            uVar15 = uVar15 - 1;
            piVar12 = piVar12 + -4;
            dVar22 = dVar17;
          } while (1 < uVar15);
          dVar22 = dVar17 + dVar20;
        }
        lVar11 = lVar14 + -1;
        dVar20 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar14 + -1];
        dVar17 = local_c8 *
                 (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar14 + -1];
        dVar22 = dVar22 * (1.0 / dVar1);
        ::soplex::infinity::__tls_init();
        dVar19 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11];
        if (dVar18 <= dVar20) {
          ::soplex::infinity::__tls_init();
          pdVar10 = (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (dVar19 <= dVar16) {
            pdVar10[lVar11] = -100000.0 - ABS(dVar22);
          }
          else {
            dVar17 = (dVar17 + 0.0) - dVar22;
LAB_0022d245:
            pdVar10[lVar11] = dVar17;
            (this->rowRight).data[lVar11] = false;
          }
        }
        else if (RVar8 <= ABS(dVar19 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                       right.val.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar11])) {
          ::soplex::infinity::__tls_init();
          dVar20 = dVar20 * local_c8;
          if (dVar19 <= dVar16) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = (0.0 - dVar20) + dVar22;
          }
          else {
            if (dVar22 <= 0.0) {
              dVar17 = dVar17 + (0.0 - dVar22);
              pdVar10 = (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              goto LAB_0022d245;
            }
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = dVar22 - dVar20;
          }
          (this->rowRight).data[lVar11] = true;
        }
        else {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = ABS(dVar22) + 10000.0;
        }
        bVar7 = 1 < lVar14;
        lVar14 = lVar11;
      } while (bVar7);
    }
  }
  else {
    local_c8 = 1.0 / local_c8;
    uVar13 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum;
    lVar14 = (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar14) {
      pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar18 = *pdVar9;
      dVar16 = -dVar18;
      uVar15 = lVar14 + 1;
      do {
        dVar19 = (double)((base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set.theitem
                          [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                           super_SVSetBase<double>.set.thekey[uVar15 - 2].idx].data.
                          super_SVectorBase<double>.memused + -1) *
                 ((0.001 / dVar1) / (double)(int)uVar13);
        dVar21 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2] * (0.001 / dVar1);
        dVar22 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        dVar17 = local_c8 *
                 (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        ::soplex::infinity::__tls_init();
        dVar20 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        if (dVar18 <= dVar22) {
          ::soplex::infinity::__tls_init();
          pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (dVar20 <= dVar16) {
            dVar19 = dVar19 + -10000.0;
            dVar21 = ABS(dVar21);
LAB_0022cb2a:
            pdVar10[uVar15 - 2] = dVar19 - dVar21;
          }
          else {
            pdVar10[uVar15 - 2] = (dVar19 + dVar17 + 10.0) - dVar21;
            (this->colUp).data[uVar15 - 2] = false;
          }
        }
        else {
          if (RVar8 <= ABS(dVar20 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.
                                    val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar15 - 2])) {
            ::soplex::infinity::__tls_init();
            dVar22 = dVar22 * local_c8;
            pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (dVar20 <= dVar16) {
              pdVar10[uVar15 - 2] = dVar19 + dVar21 + (10.0 - dVar22);
              (this->colUp).data[uVar15 - 2] = true;
              goto LAB_0022cb5f;
            }
            dVar19 = dVar19 + ((dVar17 + 10.0) - dVar22);
            pbVar5 = (this->colUp).data;
            if (ABS(dVar17) <= ABS(dVar22)) {
              pbVar5[uVar15 - 2] = false;
              goto LAB_0022cb2a;
            }
            pbVar5[uVar15 - 2] = true;
            dVar21 = dVar21 + dVar19;
          }
          else {
            dVar21 = ABS(dVar21) + dVar19 + 100000.0;
            pdVar10 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pdVar10[uVar15 - 2] = dVar21;
        }
LAB_0022cb5f:
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
      uVar13 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum;
    }
    if (0 < (int)uVar13) {
      pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar1 = *pdVar9;
      dVar18 = -dVar1;
      uVar15 = (ulong)uVar13 + 1;
      do {
        dVar16 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2];
        ::soplex::infinity::__tls_init();
        pdVar10 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (dVar1 <= dVar16) {
          dVar16 = pdVar10[uVar15 - 2];
          ::soplex::infinity::__tls_init();
          if (dVar16 <= dVar18) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15 - 2] = -100000.0;
          }
          else {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15 - 2] =
                 (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar15 - 2] * local_c8 + 0.0;
            (this->rowRight).data[uVar15 - 2] = false;
          }
        }
        else {
          dVar16 = pdVar10[uVar15 - 2];
          if (RVar8 <= ABS(dVar16 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right
                                    .val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                    .super__Vector_impl_data._M_start[uVar15 - 2])) {
            ::soplex::infinity::__tls_init();
            dVar22 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15 - 2] * local_c8;
            if (dVar16 <= dVar18) {
              (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15 - 2] = 0.0 - dVar22;
              (this->rowRight).data[uVar15 - 2] = true;
            }
            else {
              dVar16 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15 - 2] * local_c8;
              (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15 - 2] = (dVar16 + 0.0) - dVar22;
              (this->rowRight).data[uVar15 - 2] = ABS(dVar22) < ABS(dVar16);
            }
          }
          else {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15 - 2] = 0.0;
          }
        }
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}